

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_freeCCtx(ZSTDMT_CCtx *mtctx)

{
  ZSTDMT_CCtx *mtctx_local;
  
  if (mtctx != (ZSTDMT_CCtx *)0x0) {
    POOL_free(mtctx->factory);
    ZSTDMT_releaseAllJobResources(mtctx);
    ZSTDMT_freeJobsTable(mtctx->jobs,mtctx->jobIDMask + 1,mtctx->cMem);
    ZSTDMT_freeBufferPool(mtctx->bufPool);
    ZSTDMT_freeCCtxPool(mtctx->cctxPool);
    ZSTDMT_freeSeqPool(mtctx->seqPool);
    ZSTDMT_serialState_free(&mtctx->serial);
    ZSTD_freeCDict(mtctx->cdictLocal);
    if ((mtctx->roundBuff).buffer != (BYTE *)0x0) {
      ZSTD_free((mtctx->roundBuff).buffer,mtctx->cMem);
    }
    ZSTD_free(mtctx,mtctx->cMem);
  }
  return 0;
}

Assistant:

size_t ZSTDMT_freeCCtx(ZSTDMT_CCtx* mtctx)
{
    if (mtctx==NULL) return 0;   /* compatible with free on NULL */
    POOL_free(mtctx->factory);   /* stop and free worker threads */
    ZSTDMT_releaseAllJobResources(mtctx);  /* release job resources into pools first */
    ZSTDMT_freeJobsTable(mtctx->jobs, mtctx->jobIDMask+1, mtctx->cMem);
    ZSTDMT_freeBufferPool(mtctx->bufPool);
    ZSTDMT_freeCCtxPool(mtctx->cctxPool);
    ZSTDMT_freeSeqPool(mtctx->seqPool);
    ZSTDMT_serialState_free(&mtctx->serial);
    ZSTD_freeCDict(mtctx->cdictLocal);
    if (mtctx->roundBuff.buffer)
        ZSTD_free(mtctx->roundBuff.buffer, mtctx->cMem);
    ZSTD_free(mtctx, mtctx->cMem);
    return 0;
}